

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O0

ArrayPtr<const_unsigned_char> __thiscall
capnp::compiler::TypeIdGenerator::finish(TypeIdGenerator *this)

{
  ulong uVar1;
  ArrayPtr<const_unsigned_char> AVar2;
  ArrayPtr<unsigned_char> local_40;
  ulong local_30;
  unsigned_long free;
  unsigned_long used;
  TypeIdGenerator *this_local;
  
  used = (unsigned_long)this;
  if ((this->finished & 1U) == 0) {
    uVar1 = (ulong)((this->ctx).lo & 0x3f);
    free = uVar1 + 1;
    (this->ctx).buffer[uVar1] = 0x80;
    local_30 = 0x40 - free;
    if (local_30 < 8) {
      memset((this->ctx).buffer + uVar1 + 1,0,local_30);
      body(this,(this->ctx).buffer,0x40);
      free = 0;
      local_30 = 0x40;
    }
    memset((this->ctx).buffer + free,0,local_30 - 8);
    (this->ctx).lo = (this->ctx).lo << 3;
    (this->ctx).buffer[0x38] = (byte)(this->ctx).lo;
    (this->ctx).buffer[0x39] = (byte)((this->ctx).lo >> 8);
    (this->ctx).buffer[0x3a] = (byte)((this->ctx).lo >> 0x10);
    (this->ctx).buffer[0x3b] = (byte)((this->ctx).lo >> 0x18);
    (this->ctx).buffer[0x3c] = (byte)(this->ctx).hi;
    (this->ctx).buffer[0x3d] = (byte)((this->ctx).hi >> 8);
    (this->ctx).buffer[0x3e] = (byte)((this->ctx).hi >> 0x10);
    (this->ctx).buffer[0x3f] = (byte)((this->ctx).hi >> 0x18);
    body(this,(this->ctx).buffer,0x40);
    (this->ctx).buffer[0] = (byte)(this->ctx).a;
    (this->ctx).buffer[1] = (byte)((this->ctx).a >> 8);
    (this->ctx).buffer[2] = (byte)((this->ctx).a >> 0x10);
    (this->ctx).buffer[3] = (byte)((this->ctx).a >> 0x18);
    (this->ctx).buffer[4] = (byte)(this->ctx).b;
    (this->ctx).buffer[5] = (byte)((this->ctx).b >> 8);
    (this->ctx).buffer[6] = (byte)((this->ctx).b >> 0x10);
    (this->ctx).buffer[7] = (byte)((this->ctx).b >> 0x18);
    (this->ctx).buffer[8] = (byte)(this->ctx).c;
    (this->ctx).buffer[9] = (byte)((this->ctx).c >> 8);
    (this->ctx).buffer[10] = (byte)((this->ctx).c >> 0x10);
    (this->ctx).buffer[0xb] = (byte)((this->ctx).c >> 0x18);
    (this->ctx).buffer[0xc] = (byte)(this->ctx).d;
    (this->ctx).buffer[0xd] = (byte)((this->ctx).d >> 8);
    (this->ctx).buffer[0xe] = (byte)((this->ctx).d >> 0x10);
    (this->ctx).buffer[0xf] = (byte)((this->ctx).d >> 0x18);
    this->finished = true;
  }
  local_40 = kj::arrayPtr<unsigned_char>((this->ctx).buffer,0x10);
  AVar2 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_40);
  return AVar2;
}

Assistant:

kj::ArrayPtr<const kj::byte> TypeIdGenerator::finish()
{
  if (!finished) {
    unsigned long used, free;

    used = ctx.lo & 0x3f;

    ctx.buffer[used++] = 0x80;

    free = 64 - used;

    if (free < 8) {
      memset(&ctx.buffer[used], 0, free);
      body(ctx.buffer, 64);
      used = 0;
      free = 64;
    }

    memset(&ctx.buffer[used], 0, free - 8);

    ctx.lo <<= 3;
    ctx.buffer[56] = ctx.lo;
    ctx.buffer[57] = ctx.lo >> 8;
    ctx.buffer[58] = ctx.lo >> 16;
    ctx.buffer[59] = ctx.lo >> 24;
    ctx.buffer[60] = ctx.hi;
    ctx.buffer[61] = ctx.hi >> 8;
    ctx.buffer[62] = ctx.hi >> 16;
    ctx.buffer[63] = ctx.hi >> 24;

    body(ctx.buffer, 64);

    // Store final result into ctx.buffer.
    ctx.buffer[0] = ctx.a;
    ctx.buffer[1] = ctx.a >> 8;
    ctx.buffer[2] = ctx.a >> 16;
    ctx.buffer[3] = ctx.a >> 24;
    ctx.buffer[4] = ctx.b;
    ctx.buffer[5] = ctx.b >> 8;
    ctx.buffer[6] = ctx.b >> 16;
    ctx.buffer[7] = ctx.b >> 24;
    ctx.buffer[8] = ctx.c;
    ctx.buffer[9] = ctx.c >> 8;
    ctx.buffer[10] = ctx.c >> 16;
    ctx.buffer[11] = ctx.c >> 24;
    ctx.buffer[12] = ctx.d;
    ctx.buffer[13] = ctx.d >> 8;
    ctx.buffer[14] = ctx.d >> 16;
    ctx.buffer[15] = ctx.d >> 24;

    finished = true;
  }

  return kj::arrayPtr(ctx.buffer, 16);
}